

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::process_waiting_for_resolve(Server *this)

{
  size_t *psVar1;
  ushort uVar2;
  DNSResolver *this_00;
  bool bVar3;
  int forwarding_socket;
  int iVar4;
  long lVar5;
  Connection *this_01;
  _List_node_base *p_Var6;
  runtime_error *this_02;
  _Self __tmp;
  _List_node_base *p_Var7;
  sockaddr_in addr;
  sockaddr_in local_68;
  list<Connection_*,_std::allocator<Connection_*>_> *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  p_Var7 = (this->waitingForResolve).
           super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)&this->waitingForResolve) {
    local_58 = &this->connections;
    do {
      bVar3 = DNSResolver::exchange_data((DNSResolver *)p_Var7[1]._M_prev,&this->rdfds,&this->wrfds)
      ;
      if (bVar3) {
        forwarding_socket = socket(2,1,0);
        local_68.sin_family = 0;
        local_68.sin_port = 0;
        local_68.sin_addr.s_addr = 0;
        local_68.sin_zero[0] = '\0';
        local_68.sin_zero[1] = '\0';
        local_68.sin_zero[2] = '\0';
        local_68.sin_zero[3] = '\0';
        local_68.sin_zero[4] = '\0';
        local_68.sin_zero[5] = '\0';
        local_68.sin_zero[6] = '\0';
        local_68.sin_zero[7] = '\0';
        lVar5 = DNSResolver::getaddr((DNSResolver *)p_Var7[1]._M_prev);
        uVar2 = *(ushort *)((long)&p_Var7[1]._M_next + 4);
        local_68.sin_addr.s_addr = (int)lVar5;
        local_68.sin_port = uVar2 << 8 | uVar2 >> 8;
        local_68.sin_family = 2;
        this_01 = (Connection *)operator_new(0x68);
        Connection::Connection(this_01,*(int *)&p_Var7[1]._M_next,forwarding_socket,&local_68);
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = (_List_node_base *)this_01;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(this->connections).super__List_base<Connection_*,_std::allocator<Connection_*>_>.
                  _M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        iVar4 = this->maxfd;
        if (this->maxfd <= forwarding_socket) {
          iVar4 = forwarding_socket;
        }
        this->maxfd = iVar4;
        if (0x3ff < forwarding_socket) {
          this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Socket number out of range for select","");
          std::runtime_error::runtime_error(this_02,(string *)local_50);
          __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this_00 = (DNSResolver *)p_Var7[1]._M_prev;
        if (this_00 != (DNSResolver *)0x0) {
          DNSResolver::~DNSResolver(this_00);
        }
        operator_delete(this_00);
        p_Var6 = p_Var7->_M_next;
        psVar1 = &(this->waitingForResolve).
                  super__List_base<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var7);
      }
      else {
        iVar4 = DNSResolver::getfd((DNSResolver *)p_Var7[1]._M_prev);
        if (iVar4 < this->maxfd) {
          iVar4 = this->maxfd;
        }
        this->maxfd = iVar4;
        p_Var6 = p_Var7->_M_next;
      }
      p_Var7 = p_Var6;
    } while (p_Var6 != (_List_node_base *)&this->waitingForResolve);
  }
  return;
}

Assistant:

void Server::process_waiting_for_resolve() {
    for (auto i = waitingForResolve.begin();i!=waitingForResolve.end();) {
        if (i->second->exchange_data(rdfds, wrfds)) {
            int forwarding_socket = socket(AF_INET, SOCK_STREAM, 0);
            sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_addr.s_addr = i->second->getaddr();
            addr.sin_port = htons(i->first.second);
            addr.sin_family = AF_INET;
            connections.push_back(new Connection(i->first.first, forwarding_socket, &addr));
            if (!add_fd(forwarding_socket)) {
                throw std::runtime_error(std::string("Socket number out of range for select"));
            }
            delete(i->second);
            waitingForResolve.erase(i++);
        }else{
            add_fd(i->second->getfd());
            i++;
        }
    }

}